

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O0

void __thiscall rpc_tests::rpc_format_monetary_values::test_method(rpc_format_monetary_values *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffdb68;
  char *in_stack_ffffffffffffdb70;
  char *in_stack_ffffffffffffdb78;
  const_string *in_stack_ffffffffffffdb90;
  const_string *msg;
  size_t in_stack_ffffffffffffdb98;
  undefined1 *line_num;
  const_string *in_stack_ffffffffffffdba0;
  const_string *file;
  unit_test_log_t *in_stack_ffffffffffffdba8;
  char *this_00;
  rpc_format_monetary_values *this_local;
  undefined1 local_1e30 [16];
  undefined1 local_1e20 [32];
  const_string local_1e00;
  undefined1 local_1df0 [16];
  undefined1 local_1de0 [16];
  undefined1 local_1dd0 [64];
  undefined1 local_1d90 [16];
  undefined1 local_1d80 [64];
  undefined1 local_1d40 [16];
  undefined1 local_1d30 [64];
  undefined1 local_1cf0 [16];
  undefined1 local_1ce0 [64];
  undefined1 local_1ca0 [16];
  undefined1 local_1c90 [64];
  undefined1 local_1c50 [16];
  undefined1 local_1c40 [64];
  undefined1 local_1c00 [16];
  undefined1 local_1bf0 [64];
  undefined1 local_1bb0 [16];
  undefined1 local_1ba0 [64];
  undefined1 local_1b60 [16];
  undefined1 local_1b50 [64];
  undefined1 local_1b10 [16];
  undefined1 local_1b00 [64];
  undefined1 local_1ac0 [16];
  undefined1 local_1ab0 [64];
  undefined1 local_1a70 [16];
  undefined1 local_1a60 [64];
  undefined1 local_1a20 [16];
  undefined1 local_1a10 [64];
  undefined1 local_19d0 [16];
  undefined1 local_19c0 [64];
  undefined1 local_1980 [16];
  undefined1 local_1970 [64];
  undefined1 local_1930 [16];
  undefined1 local_1920 [64];
  undefined1 local_18e0 [16];
  undefined1 local_18d0 [64];
  undefined1 local_1890 [16];
  undefined1 local_1880 [64];
  undefined1 local_1840 [16];
  undefined1 local_1830 [64];
  undefined1 local_17f0 [16];
  undefined1 local_17e0 [64];
  undefined1 local_17a0 [16];
  undefined1 local_1790 [64];
  undefined1 local_1750 [16];
  undefined1 local_1740 [64];
  undefined1 local_1700 [16];
  undefined1 local_16f0 [64];
  undefined1 local_16b0 [16];
  undefined1 local_16a0 [64];
  undefined1 local_1660 [16];
  undefined1 local_1650 [64];
  undefined1 local_1610 [16];
  undefined1 local_1600 [64];
  undefined1 local_15c0 [16];
  undefined1 local_15b0 [64];
  undefined1 local_1570 [16];
  undefined1 local_1560 [64];
  const_string local_1520 [2];
  lazy_ostream local_1500 [2];
  assertion_result local_14e0 [2];
  const_string local_14a8 [2];
  lazy_ostream local_1488 [2];
  assertion_result local_1468 [2];
  const_string local_1430 [2];
  lazy_ostream local_1410 [2];
  assertion_result local_13f0 [2];
  const_string local_13b8 [2];
  lazy_ostream local_1398 [2];
  assertion_result local_1378 [2];
  const_string local_1340 [2];
  lazy_ostream local_1320 [2];
  assertion_result local_1300 [2];
  const_string local_12c8 [2];
  lazy_ostream local_12a8 [2];
  assertion_result local_1288 [2];
  const_string local_1250 [2];
  lazy_ostream local_1230 [2];
  assertion_result local_1210 [2];
  const_string local_11d8 [2];
  lazy_ostream local_11b8 [2];
  assertion_result local_1198 [2];
  undefined1 local_1160 [88];
  UniValue local_1108;
  UniValue local_1090;
  UniValue local_1018;
  UniValue local_fa0;
  UniValue local_f28;
  UniValue local_eb0;
  UniValue local_e38;
  UniValue local_dc0;
  UniValue local_d48;
  UniValue local_cd0;
  UniValue local_c58;
  UniValue local_be0;
  UniValue local_b68;
  UniValue local_af0;
  UniValue local_a78;
  UniValue local_a00;
  UniValue local_988;
  UniValue local_910;
  UniValue local_898;
  UniValue local_820;
  UniValue local_7a8;
  UniValue local_730;
  UniValue local_6b8;
  UniValue local_640;
  UniValue local_5c8;
  UniValue local_550;
  UniValue local_4d8;
  UniValue local_460;
  UniValue local_3e8;
  UniValue local_370;
  UniValue local_2f8;
  UniValue local_280;
  UniValue local_208;
  UniValue local_190;
  UniValue local_118;
  UniValue local_a0;
  undefined8 local_8;
  
  local_1018.val.field_2._M_allocated_capacity = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_
              ((UniValue *)&stack0xffffffffffffffd8,(int)&local_a0 + 0x20,(void *)0x0,0);
    std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffdb78,
               SUB81((ulong)in_stack_ffffffffffffdb70 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,
               (basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    in_stack_ffffffffffffdb68 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1198,local_11b8,local_11d8,0xe5,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdb68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdb68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_a0,(int)&local_118 + 0x20,(void *)0x0,0);
    std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffdb78,
               SUB81((ulong)in_stack_ffffffffffffdb70 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,
               (basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    in_stack_ffffffffffffdb68 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1210,local_1230,local_1250,0xe6,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdb68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdb68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_118,(int)&local_190 + 0x20,(void *)0x0,0);
    std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffdb78,
               SUB81((ulong)in_stack_ffffffffffffdb70 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,
               (basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    in_stack_ffffffffffffdb68 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1288,local_12a8,local_12c8,0xe7,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdb68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdb68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_190,(int)&local_208 + 0x20,(void *)0x0,0);
    std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffdb78,
               SUB81((ulong)in_stack_ffffffffffffdb70 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,
               (basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    in_stack_ffffffffffffdb68 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1300,local_1320,local_1340,0xe8,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdb68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdb68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_208,(int)&local_280 + 0x20,(void *)0x0,0);
    std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffdb78,
               SUB81((ulong)in_stack_ffffffffffffdb70 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,
               (basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    in_stack_ffffffffffffdb68 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1378,local_1398,local_13b8,0xe9,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdb68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdb68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_280,(int)&local_2f8 + 0x20,(void *)0x0,0);
    std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffdb78,
               SUB81((ulong)in_stack_ffffffffffffdb70 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,
               (basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    in_stack_ffffffffffffdb68 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_13f0,local_1410,local_1430,0xea,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdb68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdb68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_2f8,(int)&local_370 + 0x20,(void *)0x0,0);
    std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffdb78,
               SUB81((ulong)in_stack_ffffffffffffdb70 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,
               (basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    in_stack_ffffffffffffdb68 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1468,local_1488,local_14a8,0xeb,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdb68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdb68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_370,(int)&local_3e8 + 0x20,(void *)0x0,0);
    std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffdb78,
               SUB81((ulong)in_stack_ffffffffffffdb70 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,
               (basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    in_stack_ffffffffffffdb68 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_14e0,local_1500,local_1520,0xec,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdb68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdb68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,(char (*) [1])in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_3e8,(int)&local_460 + 0x20,(void *)0x0,0);
    in_stack_ffffffffffffdb78 = "\"0.00000000\"";
    in_stack_ffffffffffffdb70 = "0.00000000";
    in_stack_ffffffffffffdb68 = "ValueFromAmount(0).write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
              (local_1560,local_1570,0xee,1,2,&local_3e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,(char (*) [1])in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_460,(int)&local_4d8 + 0x20,(void *)0x0,0);
    in_stack_ffffffffffffdb78 = "\"12345.67890000\"";
    in_stack_ffffffffffffdb70 = "12345.67890000";
    in_stack_ffffffffffffdb68 = "ValueFromAmount((COIN/10000)*123456789).write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[15]>
              (local_15b0,local_15c0,0xef,1,2,&local_460);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,(char (*) [1])in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_4d8,(int)&local_550 + 0x20,(void *)0x0,0);
    in_stack_ffffffffffffdb78 = "\"-1.00000000\"";
    in_stack_ffffffffffffdb70 = "-1.00000000";
    in_stack_ffffffffffffdb68 = "ValueFromAmount(-COIN).write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[12]>
              (local_1600,local_1610,0xf0,1,2,&local_4d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,(char (*) [1])in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_550,(int)&local_5c8 + 0x20,(void *)0x0,0);
    in_stack_ffffffffffffdb78 = "\"-0.10000000\"";
    in_stack_ffffffffffffdb70 = "-0.10000000";
    in_stack_ffffffffffffdb68 = "ValueFromAmount(-COIN/10).write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[12]>
              (local_1650,local_1660,0xf1,1,2,&local_550);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,(char (*) [1])in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_5c8,(int)&local_640 + 0x20,(void *)0x0,0);
    in_stack_ffffffffffffdb78 = "\"100000000.00000000\"";
    in_stack_ffffffffffffdb70 = "100000000.00000000";
    in_stack_ffffffffffffdb68 = "ValueFromAmount(COIN*100000000).write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[19]>
              (local_16a0,local_16b0,0xf3,1,2,&local_5c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,(char (*) [1])in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_640,(int)&local_6b8 + 0x20,(void *)0x0,0);
    in_stack_ffffffffffffdb78 = "\"10000000.00000000\"";
    in_stack_ffffffffffffdb70 = "10000000.00000000";
    in_stack_ffffffffffffdb68 = "ValueFromAmount(COIN*10000000).write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[18]>
              (local_16f0,local_1700,0xf4,1,2,&local_640);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,(char (*) [1])in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_6b8,(int)&local_730 + 0x20,(void *)0x0,0);
    in_stack_ffffffffffffdb78 = "\"1000000.00000000\"";
    in_stack_ffffffffffffdb70 = "1000000.00000000";
    in_stack_ffffffffffffdb68 = "ValueFromAmount(COIN*1000000).write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[17]>
              (local_1740,local_1750,0xf5,1,2,&local_6b8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,(char (*) [1])in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_730,(int)&local_7a8 + 0x20,(void *)0x0,0);
    in_stack_ffffffffffffdb78 = "\"100000.00000000\"";
    in_stack_ffffffffffffdb70 = "100000.00000000";
    in_stack_ffffffffffffdb68 = "ValueFromAmount(COIN*100000).write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[16]>
              (local_1790,local_17a0,0xf6,1,2,&local_730);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,(char (*) [1])in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_7a8,(int)&local_820 + 0x20,(void *)0x0,0);
    in_stack_ffffffffffffdb78 = "\"10000.00000000\"";
    in_stack_ffffffffffffdb70 = "10000.00000000";
    in_stack_ffffffffffffdb68 = "ValueFromAmount(COIN*10000).write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[15]>
              (local_17e0,local_17f0,0xf7,1,2,&local_7a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,(char (*) [1])in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_820,(int)&local_898 + 0x20,(void *)0x0,0);
    in_stack_ffffffffffffdb78 = "\"1000.00000000\"";
    in_stack_ffffffffffffdb70 = "1000.00000000";
    in_stack_ffffffffffffdb68 = "ValueFromAmount(COIN*1000).write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[14]>
              (local_1830,local_1840,0xf8,1,2,&local_820);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,(char (*) [1])in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_898,(int)&local_910 + 0x20,(void *)0x0,0);
    in_stack_ffffffffffffdb78 = "\"100.00000000\"";
    in_stack_ffffffffffffdb70 = "100.00000000";
    in_stack_ffffffffffffdb68 = "ValueFromAmount(COIN*100).write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[13]>
              (local_1880,local_1890,0xf9,1,2,&local_898);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,(char (*) [1])in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_910,(int)&local_988 + 0x20,(void *)0x0,0);
    in_stack_ffffffffffffdb78 = "\"10.00000000\"";
    in_stack_ffffffffffffdb70 = "10.00000000";
    in_stack_ffffffffffffdb68 = "ValueFromAmount(COIN*10).write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[12]>
              (local_18d0,local_18e0,0xfa,1,2,&local_910);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,(char (*) [1])in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_988,(int)&local_a00 + 0x20,(void *)0x0,0);
    in_stack_ffffffffffffdb78 = "\"1.00000000\"";
    in_stack_ffffffffffffdb70 = "1.00000000";
    in_stack_ffffffffffffdb68 = "ValueFromAmount(COIN).write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
              (local_1920,local_1930,0xfb,1,2,&local_988);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,(char (*) [1])in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_a00,(int)&local_a78 + 0x20,(void *)0x0,0);
    in_stack_ffffffffffffdb78 = "\"0.10000000\"";
    in_stack_ffffffffffffdb70 = "0.10000000";
    in_stack_ffffffffffffdb68 = "ValueFromAmount(COIN/10).write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
              (local_1970,local_1980,0xfc,1,2,&local_a00);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,(char (*) [1])in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_a78,(int)&local_af0 + 0x20,(void *)0x0,0);
    in_stack_ffffffffffffdb78 = "\"0.01000000\"";
    in_stack_ffffffffffffdb70 = "0.01000000";
    in_stack_ffffffffffffdb68 = "ValueFromAmount(COIN/100).write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
              (local_19c0,local_19d0,0xfd,1,2,&local_a78);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,(char (*) [1])in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_af0,(int)&local_b68 + 0x20,(void *)0x0,0);
    in_stack_ffffffffffffdb78 = "\"0.00100000\"";
    in_stack_ffffffffffffdb70 = "0.00100000";
    in_stack_ffffffffffffdb68 = "ValueFromAmount(COIN/1000).write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
              (local_1a10,local_1a20,0xfe,1,2,&local_af0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,(char (*) [1])in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_b68,(int)&local_be0 + 0x20,(void *)0x0,0);
    in_stack_ffffffffffffdb78 = "\"0.00010000\"";
    in_stack_ffffffffffffdb70 = "0.00010000";
    in_stack_ffffffffffffdb68 = "ValueFromAmount(COIN/10000).write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
              (local_1a60,local_1a70,0xff,1,2,&local_b68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,(char (*) [1])in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_be0,(int)&local_c58 + 0x20,(void *)0x0,0);
    in_stack_ffffffffffffdb78 = "\"0.00001000\"";
    in_stack_ffffffffffffdb70 = "0.00001000";
    in_stack_ffffffffffffdb68 = "ValueFromAmount(COIN/100000).write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
              (local_1ab0,local_1ac0,0x100,1,2,&local_be0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,(char (*) [1])in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_c58,(int)&local_cd0 + 0x20,(void *)0x0,0);
    in_stack_ffffffffffffdb78 = "\"0.00000100\"";
    in_stack_ffffffffffffdb70 = "0.00000100";
    in_stack_ffffffffffffdb68 = "ValueFromAmount(COIN/1000000).write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
              (local_1b00,local_1b10,0x101,1,2,&local_c58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,(char (*) [1])in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_cd0,(int)&local_d48 + 0x20,(void *)0x0,0);
    in_stack_ffffffffffffdb78 = "\"0.00000010\"";
    in_stack_ffffffffffffdb70 = "0.00000010";
    in_stack_ffffffffffffdb68 = "ValueFromAmount(COIN/10000000).write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
              (local_1b50,local_1b60,0x102,1,2,&local_cd0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,(char (*) [1])in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_d48,(int)&local_dc0 + 0x20,(void *)0x0,0);
    in_stack_ffffffffffffdb78 = "\"0.00000001\"";
    in_stack_ffffffffffffdb70 = "0.00000001";
    in_stack_ffffffffffffdb68 = "ValueFromAmount(COIN/100000000).write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
              (local_1ba0,local_1bb0,0x103,1,2,&local_d48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,(char (*) [1])in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    std::numeric_limits<long>::max();
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_dc0,(int)&local_e38 + 0x20,(void *)0x0,0);
    in_stack_ffffffffffffdb78 = "\"92233720368.54775807\"";
    in_stack_ffffffffffffdb70 = "92233720368.54775807";
    in_stack_ffffffffffffdb68 = "ValueFromAmount(std::numeric_limits<CAmount>::max()).write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[21]>
              (local_1bf0,local_1c00,0x105,1,2,&local_dc0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,(char (*) [1])in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    std::numeric_limits<long>::max();
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_e38,(int)&local_eb0 + 0x20,(void *)0x0,0);
    in_stack_ffffffffffffdb78 = "\"92233720368.54775806\"";
    in_stack_ffffffffffffdb70 = "92233720368.54775806";
    in_stack_ffffffffffffdb68 = "ValueFromAmount(std::numeric_limits<CAmount>::max() - 1).write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[21]>
              (local_1c40,local_1c50,0x106,1,2,&local_e38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,(char (*) [1])in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    std::numeric_limits<long>::max();
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_eb0,(int)&local_f28 + 0x20,(void *)0x0,0);
    in_stack_ffffffffffffdb78 = "\"92233720368.54775805\"";
    in_stack_ffffffffffffdb70 = "92233720368.54775805";
    in_stack_ffffffffffffdb68 = "ValueFromAmount(std::numeric_limits<CAmount>::max() - 2).write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[21]>
              (local_1c90,local_1ca0,0x107,1,2,&local_eb0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,(char (*) [1])in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    std::numeric_limits<long>::max();
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_f28,(int)&local_fa0 + 0x20,(void *)0x0,0);
    in_stack_ffffffffffffdb78 = "\"92233720368.54775804\"";
    in_stack_ffffffffffffdb70 = "92233720368.54775804";
    in_stack_ffffffffffffdb68 = "ValueFromAmount(std::numeric_limits<CAmount>::max() - 3).write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[21]>
              (local_1ce0,local_1cf0,0x108,1,2,&local_f28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,(char (*) [1])in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    std::numeric_limits<long>::min();
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_fa0,(int)&local_1018 + 0x20,(void *)0x0,0);
    in_stack_ffffffffffffdb78 = "\"-92233720368.54775805\"";
    in_stack_ffffffffffffdb70 = "-92233720368.54775805";
    in_stack_ffffffffffffdb68 = "ValueFromAmount(std::numeric_limits<CAmount>::min() + 3).write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[22]>
              (local_1d30,local_1d40,0x10a,1,2,&local_fa0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,(char (*) [1])in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    std::numeric_limits<long>::min();
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_1018,(int)&local_1090 + 0x20,(void *)0x0,0);
    in_stack_ffffffffffffdb78 = "\"-92233720368.54775806\"";
    in_stack_ffffffffffffdb70 = "-92233720368.54775806";
    in_stack_ffffffffffffdb68 = "ValueFromAmount(std::numeric_limits<CAmount>::min() + 2).write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[22]>
              (local_1d80,local_1d90,0x10b,1,2,&local_1018);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffdba8,in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,
               in_stack_ffffffffffffdb90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,(char (*) [1])in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    std::numeric_limits<long>::min();
    ValueFromAmount(in_stack_ffffffffffffdb98);
    UniValue::write_abi_cxx11_(&local_1090,(int)&local_1108 + 0x20,(void *)0x0,0);
    in_stack_ffffffffffffdb78 = "\"-92233720368.54775807\"";
    in_stack_ffffffffffffdb70 = "-92233720368.54775807";
    in_stack_ffffffffffffdb68 = "ValueFromAmount(std::numeric_limits<CAmount>::min() + 1).write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[22]>
              (local_1dd0,local_1de0,0x10c,1,2,&local_1090);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    this_00 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
    ;
    line_num = local_1df0;
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    file = &local_1e00;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_00,file,(size_t)line_num,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffdb70,(char (*) [1])in_stack_ffffffffffffdb68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb70,
               (unsigned_long)in_stack_ffffffffffffdb68);
    std::numeric_limits<long>::min();
    ValueFromAmount((CAmount)line_num);
    UniValue::write_abi_cxx11_(&local_1108,(int)local_1160,(void *)0x0,0);
    in_stack_ffffffffffffdb78 = "\"-92233720368.54775808\"";
    in_stack_ffffffffffffdb70 = "-92233720368.54775808";
    in_stack_ffffffffffffdb68 = "ValueFromAmount(std::numeric_limits<CAmount>::min()).write()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[22]>
              (local_1e20,local_1e30,0x10d,1,2,&local_1108);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdb68);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffdb68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdb68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(rpc_format_monetary_values)
{
    BOOST_CHECK(ValueFromAmount(0LL).write() == "0.00000000");
    BOOST_CHECK(ValueFromAmount(1LL).write() == "0.00000001");
    BOOST_CHECK(ValueFromAmount(17622195LL).write() == "0.17622195");
    BOOST_CHECK(ValueFromAmount(50000000LL).write() == "0.50000000");
    BOOST_CHECK(ValueFromAmount(89898989LL).write() == "0.89898989");
    BOOST_CHECK(ValueFromAmount(100000000LL).write() == "1.00000000");
    BOOST_CHECK(ValueFromAmount(2099999999999990LL).write() == "20999999.99999990");
    BOOST_CHECK(ValueFromAmount(2099999999999999LL).write() == "20999999.99999999");

    BOOST_CHECK_EQUAL(ValueFromAmount(0).write(), "0.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount((COIN/10000)*123456789).write(), "12345.67890000");
    BOOST_CHECK_EQUAL(ValueFromAmount(-COIN).write(), "-1.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(-COIN/10).write(), "-0.10000000");

    BOOST_CHECK_EQUAL(ValueFromAmount(COIN*100000000).write(), "100000000.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN*10000000).write(), "10000000.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN*1000000).write(), "1000000.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN*100000).write(), "100000.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN*10000).write(), "10000.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN*1000).write(), "1000.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN*100).write(), "100.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN*10).write(), "10.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN).write(), "1.00000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN/10).write(), "0.10000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN/100).write(), "0.01000000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN/1000).write(), "0.00100000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN/10000).write(), "0.00010000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN/100000).write(), "0.00001000");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN/1000000).write(), "0.00000100");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN/10000000).write(), "0.00000010");
    BOOST_CHECK_EQUAL(ValueFromAmount(COIN/100000000).write(), "0.00000001");

    BOOST_CHECK_EQUAL(ValueFromAmount(std::numeric_limits<CAmount>::max()).write(), "92233720368.54775807");
    BOOST_CHECK_EQUAL(ValueFromAmount(std::numeric_limits<CAmount>::max() - 1).write(), "92233720368.54775806");
    BOOST_CHECK_EQUAL(ValueFromAmount(std::numeric_limits<CAmount>::max() - 2).write(), "92233720368.54775805");
    BOOST_CHECK_EQUAL(ValueFromAmount(std::numeric_limits<CAmount>::max() - 3).write(), "92233720368.54775804");
    // ...
    BOOST_CHECK_EQUAL(ValueFromAmount(std::numeric_limits<CAmount>::min() + 3).write(), "-92233720368.54775805");
    BOOST_CHECK_EQUAL(ValueFromAmount(std::numeric_limits<CAmount>::min() + 2).write(), "-92233720368.54775806");
    BOOST_CHECK_EQUAL(ValueFromAmount(std::numeric_limits<CAmount>::min() + 1).write(), "-92233720368.54775807");
    BOOST_CHECK_EQUAL(ValueFromAmount(std::numeric_limits<CAmount>::min()).write(), "-92233720368.54775808");
}